

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NumeralMultiplicationGeneralizationImpl.hpp
# Opt level: O0

Result Inferences::NumeralMultiplicationGeneralizationImpl::applyRule
                 (Clause *cl,bool doOrderingCheck)

{
  Iterator i;
  bool bVar1;
  ResultOf<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Coproduct_hpp:601:3),_Constant<0>_>
  RVar2;
  Coproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType>
  *pCVar3;
  Entry *pEVar4;
  undefined8 extraout_RDX;
  byte in_SIL;
  Clause *in_RDI;
  Result RVar5;
  Generalize gen;
  Entry *e_1;
  FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>
  num;
  Entry *e;
  StlIter __end2_1;
  StlIter __begin2_1;
  IterTraits<Lib::Map<Kernel::Variable,_Inferences::FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>,_Lib::StlHash>::Iterator>
  *__range2_1;
  Option<Lib::Map<Kernel::Variable,_Inferences::FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>,_Lib::StlHash>::Entry_&>
  selected;
  Elem poly;
  StlIter __end2;
  StlIter __begin2;
  IterTraits<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:31:14),_Lib::IterTraits<Kernel::IterArgsPnf>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:32:14),_Kernel::PolyNf::SubtermIter>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:70:16)>_>
  *__range2;
  NumeralMap numerals;
  undefined7 in_stack_fffffffffffffcf8;
  undefined1 in_stack_fffffffffffffcff;
  Generalize *in_stack_fffffffffffffd00;
  Entry *in_stack_fffffffffffffd08;
  anon_class_8_1_77ab4f93 in_stack_fffffffffffffd10;
  StlIter *in_stack_fffffffffffffd30;
  Clause *in_stack_fffffffffffffd90;
  undefined7 in_stack_fffffffffffffd98;
  undefined1 in_stack_fffffffffffffd9f;
  Elem in_stack_fffffffffffffe68;
  Clause *in_stack_fffffffffffffe70;
  Iterator local_160;
  Iterator *local_150;
  OptionBaseRef<Lib::Map<Kernel::Variable,_Inferences::FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>,_Lib::StlHash>::Entry_*>
  local_148;
  undefined1 *local_140;
  undefined1 local_d0 [136];
  undefined1 *local_48;
  undefined1 local_40 [39];
  byte local_19;
  Clause *local_18;
  Clause *local_10;
  undefined1 local_8;
  
  local_19 = in_SIL & 1;
  local_18 = in_RDI;
  Lib::
  Map<Kernel::Variable,_Inferences::FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>,_Lib::StlHash>
  ::Map((Map<Kernel::Variable,_Inferences::FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>,_Lib::StlHash>
         *)0x72a3e8);
  Inferences::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)
             CONCAT17(in_stack_fffffffffffffd9f,in_stack_fffffffffffffd98),in_stack_fffffffffffffd90
            );
  local_48 = local_d0;
  Lib::
  IterTraits<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:31:14),_Lib::IterTraits<Kernel::IterArgsPnf>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:32:14),_Kernel::PolyNf::SubtermIter>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:70:16)>_>
  ::begin((IterTraits<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:31:14),_Lib::IterTraits<Kernel::IterArgsPnf>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:32:14),_Kernel::PolyNf::SubtermIter>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:70:16)>_>
           *)CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8));
  Lib::
  IterTraits<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:31:14),_Lib::IterTraits<Kernel::IterArgsPnf>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:32:14),_Kernel::PolyNf::SubtermIter>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:70:16)>_>
  ::end((IterTraits<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:31:14),_Lib::IterTraits<Kernel::IterArgsPnf>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:32:14),_Kernel::PolyNf::SubtermIter>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:70:16)>_>
         *)CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8));
  while (bVar1 = Lib::operator()((StlIter *)in_stack_fffffffffffffd00,
                                 (StlIter *)
                                 CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8)),
        bVar1) {
    Lib::
    IterTraits<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:31:14),_Lib::IterTraits<Kernel::IterArgsPnf>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:32:14),_Kernel::PolyNf::SubtermIter>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:70:16)>_>
    ::StlIter::operator*((StlIter *)in_stack_fffffffffffffd08);
    local_140 = local_40;
    Lib::
    Coproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Lib::PerfectIdComparison>,Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>>,Lib::PerfectIdComparison>,Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>>,Lib::PerfectIdComparison>>
    ::
    apply<Inferences::NumeralMultiplicationGeneralizationImpl::applyRule(Kernel::Clause*,bool)::__0>
              ((Coproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
                *)in_stack_fffffffffffffd08,in_stack_fffffffffffffd10);
    Lib::
    IterTraits<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:31:14),_Lib::IterTraits<Kernel::IterArgsPnf>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:32:14),_Kernel::PolyNf::SubtermIter>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:70:16)>_>
    ::StlIter::operator++(in_stack_fffffffffffffd30);
  }
  Lib::
  IterTraits<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:31:14),_Lib::IterTraits<Kernel::IterArgsPnf>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:32:14),_Kernel::PolyNf::SubtermIter>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:70:16)>_>
  ::StlIter::~StlIter((StlIter *)0x72a482);
  Lib::
  IterTraits<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:31:14),_Lib::IterTraits<Kernel::IterArgsPnf>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:32:14),_Kernel::PolyNf::SubtermIter>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:70:16)>_>
  ::StlIter::~StlIter((StlIter *)0x72a48f);
  Lib::
  IterTraits<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:31:14),_Lib::IterTraits<Kernel::IterArgsPnf>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:32:14),_Kernel::PolyNf::SubtermIter>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:70:16)>_>
  ::~IterTraits((IterTraits<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:31:14),_Lib::IterTraits<Kernel::IterArgsPnf>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:32:14),_Kernel::PolyNf::SubtermIter>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:70:16)>_>
                 *)0x72a49c);
  Lib::
  Option<Lib::Map<Kernel::Variable,_Inferences::FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>,_Lib::StlHash>::Entry_&>
  ::Option((Option<Lib::Map<Kernel::Variable,_Inferences::FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>,_Lib::StlHash>::Entry_&>
            *)0x72a58c);
  Lib::
  Map<Kernel::Variable,_Inferences::FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>,_Lib::StlHash>
  ::iter((Map<Kernel::Variable,_Inferences::FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>,_Lib::StlHash>
          *)0x72a59b);
  i._last = (Entry *)in_stack_fffffffffffffd10.numerals;
  i._next = in_stack_fffffffffffffd08;
  local_160 = (Iterator)
              Lib::
              iterTraits<Lib::Map<Kernel::Variable,Inferences::FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>>,Lib::StlHash>::Iterator>
                        (i);
  local_150 = &local_160;
  Lib::
  IterTraits<Lib::Map<Kernel::Variable,_Inferences::FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>,_Lib::StlHash>::Iterator>
  ::begin((IterTraits<Lib::Map<Kernel::Variable,_Inferences::FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>,_Lib::StlHash>::Iterator>
           *)CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8));
  Lib::
  IterTraits<Lib::Map<Kernel::Variable,_Inferences::FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>,_Lib::StlHash>::Iterator>
  ::end((IterTraits<Lib::Map<Kernel::Variable,_Inferences::FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>,_Lib::StlHash>::Iterator>
         *)CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8));
  do {
    bVar1 = Lib::operator!=((StlIter *)in_stack_fffffffffffffd00,
                            (StlIter *)CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8)
                           );
    if (!bVar1) {
      bVar1 = Lib::
              Option<Lib::Map<Kernel::Variable,_Inferences::FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>,_Lib::StlHash>::Entry_&>
              ::isNone((Option<Lib::Map<Kernel::Variable,_Inferences::FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>,_Lib::StlHash>::Entry_&>
                        *)0x72a82a);
      if (bVar1) {
        RVar5 = SimplifyingGeneratingInference1::Result::nop(local_18);
        local_10 = RVar5.simplified;
        local_8 = RVar5.premiseRedundant;
      }
      else {
        pEVar4 = Lib::
                 OptionBaseRef<Lib::Map<Kernel::Variable,_Inferences::FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>,_Lib::StlHash>::Entry_*>
                 ::unwrap(&local_148);
        Lib::
        Map<Kernel::Variable,_Inferences::FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>,_Lib::StlHash>
        ::Entry::key(pEVar4);
        Lib::
        Map<Kernel::Variable,_Inferences::FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>,_Lib::StlHash>
        ::Entry::value(pEVar4);
        FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>
        ::unwrap((FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>
                  *)0x72a8f5);
        AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>::AnyNumber
                  ((AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral> *)
                   in_stack_fffffffffffffd00,
                   (AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral> *)
                   CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8));
        Generalize::Generalize
                  (in_stack_fffffffffffffd00,
                   (Generalize *)CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8));
        RVar5 = generalizeBottomUp<Inferences::EvaluateMonom<Inferences::NumeralMultiplicationGeneralizationImpl::Generalize>>
                          (in_stack_fffffffffffffe70,
                           (EvaluateMonom<Inferences::NumeralMultiplicationGeneralizationImpl::Generalize>
                            *)in_stack_fffffffffffffe68);
        local_10 = RVar5.simplified;
        local_8 = RVar5.premiseRedundant;
        EvaluateMonom<Inferences::NumeralMultiplicationGeneralizationImpl::Generalize>::
        ~EvaluateMonom((EvaluateMonom<Inferences::NumeralMultiplicationGeneralizationImpl::Generalize>
                        *)0x72a983);
        Generalize::~Generalize((Generalize *)0x72a99b);
      }
      Lib::
      Map<Kernel::Variable,_Inferences::FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>,_Lib::StlHash>
      ::~Map((Map<Kernel::Variable,_Inferences::FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>,_Lib::StlHash>
              *)0x72a9f0);
      RVar5._9_7_ = (undefined7)((ulong)extraout_RDX >> 8);
      RVar5.premiseRedundant = (bool)local_8;
      RVar5.simplified = local_10;
      return RVar5;
    }
    in_stack_fffffffffffffe68 =
         Lib::
         IterTraits<Lib::Map<Kernel::Variable,_Inferences::FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>,_Lib::StlHash>::Iterator>
         ::StlIter::operator*((StlIter *)0x72a68f);
    Lib::
    Map<Kernel::Variable,_Inferences::FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>,_Lib::StlHash>
    ::Entry::value(in_stack_fffffffffffffe68);
    FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>
    ::FlatMeetLattice((FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>
                       *)in_stack_fffffffffffffd00,
                      (FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>
                       *)CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8));
    bVar1 = FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>
            ::isBot((FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>
                     *)0x72a6e4);
    if (!bVar1) {
      pCVar3 = &FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>
                ::unwrap((FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>
                          *)0x72a70b)->
                super_Coproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType>
      ;
      RVar2 = Lib::
              Coproduct<Kernel::IntegerConstantType,Kernel::RationalConstantType,Kernel::RealConstantType>
              ::apply<Inferences::NumeralMultiplicationGeneralizationImpl::__10>(pCVar3);
      if (!RVar2) {
        bVar1 = Lib::
                Option<Lib::Map<Kernel::Variable,_Inferences::FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>,_Lib::StlHash>::Entry_&>
                ::isNone((Option<Lib::Map<Kernel::Variable,_Inferences::FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>,_Lib::StlHash>::Entry_&>
                          *)0x72a743);
        if (!bVar1) {
          Lib::
          Map<Kernel::Variable,_Inferences::FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>,_Lib::StlHash>
          ::Entry::key(in_stack_fffffffffffffe68);
          pEVar4 = Lib::
                   OptionBaseRef<Lib::Map<Kernel::Variable,_Inferences::FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>,_Lib::StlHash>::Entry_*>
                   ::unwrap(&local_148);
          Lib::
          Map<Kernel::Variable,_Inferences::FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>,_Lib::StlHash>
          ::Entry::key(pEVar4);
          bVar1 = Kernel::operator<((SymbolId *)in_stack_fffffffffffffd00,
                                    (SymbolId *)
                                    CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8));
          if (!bVar1) goto LAB_0072a7fc;
        }
        Lib::
        Option<Lib::Map<Kernel::Variable,_Inferences::FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>,_Lib::StlHash>::Entry_&>
        ::OptionBase((Option<Lib::Map<Kernel::Variable,_Inferences::FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>,_Lib::StlHash>::Entry_&>
                      *)in_stack_fffffffffffffd00,
                     (Entry *)CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8));
      }
    }
LAB_0072a7fc:
    FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>
    ::~FlatMeetLattice((FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>
                        *)0x72a809);
    Lib::
    IterTraits<Lib::Map<Kernel::Variable,_Inferences::FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>,_Lib::StlHash>::Iterator>
    ::StlIter::operator++((StlIter *)in_stack_fffffffffffffd00);
  } while( true );
}

Assistant:

SimplifyingGeneratingInference1::Result applyRule(Clause* cl, bool doOrderingCheck) 
{
  DEBUG("input clause: ", *cl);

  NumeralMap numerals;

  /* scan candidate numeral multiplications n * x  */
  for (auto poly : iterPolynoms(cl)) {
    poly.apply([&](auto& poly) {
      for (auto monom : poly->iterSummands()) {
        for (auto factor : monom.factors->iter()) {
          
          auto var = factor.term.tryVar();
          if (var.isSome()) {
            auto numeral = FlatMeetLattice<AnyNumber<Numeral>>(AnyNumber<Numeral>(monom.numeral));

            if (factor.power == 1 && canDivideBy(monom.numeral)) {
              /* we found numeral * var */
              numerals.updateOrInit(var.unwrap(), 
                  /* update the numeral if there was already one associated with this variable */
                  [&](auto n) 
                  { return n.meet(numeral); },
                  /* init the numeral if there was none */
                  [&]() { return numeral; });
            } else {
              ASS_NEQ(factor.power, 0)
              /* x^n ==> we cannot generalize. hence we set the numeral for this variable to bottom. */
              numerals.replaceOrInsert(var.unwrap(), FlatMeetLattice<AnyNumber<Numeral>>::bot());
            }
          }
        }
      }
    });
  }

  /* select one of the variables we can generalize on */
  Option<typename NumeralMap::Entry &> selected;
  for (auto& e : iterTraits(numerals.iter()) ) {
    FlatMeetLattice<AnyNumber<Numeral>> num = e.value();
    if (!num.isBot() && !num.unwrap().apply(isOne)) {
      /* we use the entry with the least variable, in order to prevent non-determinism */
      if (selected.isNone() || e.key() < selected.unwrap().key()) {
        selected = decltype(selected)(e);
      }
    }
  }

  if (selected.isNone()) {
    DEBUG("not applicable")
    return SimplifyingGeneratingInference1::Result::nop(cl);
  } else {
    auto& e = selected.unwrap();
    DEBUG("selected generalization: (", e.key(), ", ", e.value(), ")");
    Generalize gen { e.key(), e.value().unwrap(), doOrderingCheck };
    return generalizeBottomUp(cl, EvaluateMonom<Generalize> {gen});
  }
}